

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O0

int __thiscall
SPP::solveSPV(SPP *this,Satellite **GPSPosAndVel,Satellite **BDSPosAndVel,Obs **GPSObs,Obs **BDSObs,
             Ephemeris **GPSEph,Ephemeris **BDSEph,ELLIPSOID type)

{
  float fVar1;
  double dVar2;
  double dVar3;
  Satellite *pSVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  code *pcVar10;
  XYZ a;
  XYZ a_00;
  XYZ b;
  XYZ b_00;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int col;
  double *pdVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double in_stack_fffffffffffffc68;
  double dVar20;
  int local_334;
  undefined1 local_330 [4];
  int i_2;
  Vector3d dx;
  double sigma;
  undefined1 auStack_310 [4];
  int Obsnum;
  MatrixXd tmp10;
  MatrixXd tmp9;
  MatrixXd tmp8;
  MatrixXd tmp7;
  MatrixXd tmp6;
  MatrixXd v;
  MatrixXd tmp5;
  MatrixXd tmp4;
  MatrixXd tmp3;
  MatrixXd tmp2;
  MatrixXd tmp1;
  MatrixXd B_T;
  int flag;
  double roudot_1;
  double deltatdot_1;
  double n_1;
  double m_1;
  double l_1;
  double rou_1;
  XYZ pos_1;
  XYZ SatPosi_1;
  XYZ fix_1;
  int prn_1;
  double roudot;
  double deltatdot;
  double n;
  double m;
  double l;
  double rou;
  XYZ pos;
  XYZ SatPosi;
  XYZ fix;
  int prn;
  int num;
  double R;
  int count;
  undefined1 local_b8 [8];
  XYZ RefV;
  MatrixXd w;
  MatrixXd P;
  MatrixXd B;
  XYZ RefPos;
  int local_50;
  int i_1;
  int i;
  int cols;
  int BDSObsNum;
  int GPSObsNum;
  Ephemeris **GPSEph_local;
  Obs **BDSObs_local;
  Obs **GPSObs_local;
  Satellite **BDSPosAndVel_local;
  Satellite **GPSPosAndVel_local;
  SPP *this_local;
  
  cols = 0;
  i = 0;
  for (local_50 = 0; local_50 < 0x20; local_50 = local_50 + 1) {
    if ((((*GPSPosAndVel)[local_50].n != -1.0) || (NAN((*GPSPosAndVel)[local_50].n))) &&
       (((*GPSObs)[local_50].dopp[0] != -1.0 || (NAN((*GPSObs)[local_50].dopp[0]))))) {
      cols = cols + 1;
    }
  }
  for (RefPos.Z._4_4_ = 0; RefPos.Z._4_4_ < 0x40; RefPos.Z._4_4_ = RefPos.Z._4_4_ + 1) {
    if ((((*BDSPosAndVel)[RefPos.Z._4_4_].n != -1.0) || (NAN((*BDSPosAndVel)[RefPos.Z._4_4_].n))) &&
       (((*BDSObs)[RefPos.Z._4_4_].dopp[0] != -1.0 || (NAN((*BDSObs)[RefPos.Z._4_4_].dopp[0]))))) {
      i = i + 1;
    }
  }
  dVar20 = (this->result).UserPositionXYZ.X;
  dVar2 = (this->result).UserPositionXYZ.Y;
  dVar3 = (this->result).UserPositionXYZ.Z;
  if ((dVar3 != -1.0) || (NAN(dVar3))) {
    Matrix<double,_-1,_-1>::Matrix((Matrix<double,__1,__1> *)&P.data,i + cols,4);
    iVar15 = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)&P.data);
    col = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)&P.data);
    Matrix<double,_-1,_-1>::Matrix((Matrix<double,__1,__1> *)&w.data,iVar15,col);
    iVar15 = Matrix<double,_-1,_-1>::row((Matrix<double,__1,__1> *)&P.data);
    Matrix<double,_-1,_-1>::Matrix((Matrix<double,__1,__1> *)&RefV.Z,iVar15,1);
    XYZ::XYZ((XYZ *)local_b8,0.0,0.0,0.0);
    Matrix<double,_-1,_-1>::Zero((Matrix<double,__1,__1> *)&P.data);
    Matrix<double,_-1,_-1>::Zero((Matrix<double,__1,__1> *)&w.data);
    fix.Z._4_4_ = 0;
    fix.Z._0_4_ = 0;
    while ((fix.Z._0_4_ < 0x20 && (cols != 0))) {
      if ((((*GPSPosAndVel)[fix.Z._0_4_].n != -1.0) || (NAN((*GPSPosAndVel)[fix.Z._0_4_].n))) &&
         (((*GPSObs)[fix.Z._0_4_].dopp[0] != -1.0 || (NAN((*GPSObs)[fix.Z._0_4_].dopp[0]))))) {
        pSVar4 = *GPSPosAndVel;
        dVar5 = pSVar4[fix.Z._0_4_].SatVelocity.X;
        dVar6 = pSVar4[fix.Z._0_4_].SatVelocity.Y;
        dVar7 = pSVar4[fix.Z._0_4_].SatVelocity.Z;
        pdVar16 = (double *)(&(this->result).field_0x670 + (long)fix.Z._0_4_ * 0x18);
        dVar8 = *pdVar16;
        dVar19 = *(double *)*(undefined1 (*) [16])(pdVar16 + 1);
        dVar9 = pdVar16[2];
        uVar11 = (this->result).UserPositionXYZ.Y;
        uVar12 = (this->result).UserPositionXYZ.Z;
        b.Y = (double)uVar12;
        b.X = (double)uVar11;
        a.Z = (this->result).UserPositionXYZ.X;
        a._0_16_ = *(undefined1 (*) [16])(pdVar16 + 1);
        b.Z = in_stack_fffffffffffffc68;
        dVar17 = dist(a,b);
        dVar18 = (-dVar8 + dVar20) / dVar17;
        dVar19 = (-dVar19 + dVar2) / dVar17;
        dVar17 = (-dVar9 + dVar3) / dVar17;
        dVar8 = (*GPSPosAndVel)[fix.Z._0_4_].clkdot;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&P.data,fix.Z._4_4_,0);
        *pdVar16 = dVar18;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&P.data,fix.Z._4_4_,1);
        *pdVar16 = dVar19;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&P.data,fix.Z._4_4_,2);
        *pdVar16 = dVar17;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&P.data,fix.Z._4_4_,3);
        *pdVar16 = 1.0;
        fVar1 = (*GPSObs)[fix.Z._0_4_].dopp[0];
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&RefV.Z,fix.Z._4_4_,0);
        *pdVar16 = (dVar8 * 299792458.0 +
                   (((double)-fVar1 * 299792458.0) / 1575420000.0 -
                   (-dVar17 * dVar7 + -dVar18 * dVar5 + -(dVar19 * dVar6)))) - 0.0;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&w.data,fix.Z._4_4_,fix.Z._4_4_);
        *pdVar16 = 1.0;
        fix.Z._4_4_ = fix.Z._4_4_ + 1;
      }
      fix.Z._0_4_ = fix.Z._0_4_ + 1;
    }
    fix_1.Z._4_4_ = 0;
    while ((fix_1.Z._4_4_ < 0x40 && (i != 0))) {
      if ((((*BDSPosAndVel)[fix_1.Z._4_4_].n != -1.0) || (NAN((*BDSPosAndVel)[fix_1.Z._4_4_].n))) &&
         (((*BDSObs)[fix_1.Z._4_4_].dopp[0] != -1.0 || (NAN((*BDSObs)[fix_1.Z._4_4_].dopp[0]))))) {
        pSVar4 = *BDSPosAndVel;
        dVar5 = pSVar4[fix_1.Z._4_4_].SatVelocity.X;
        dVar6 = pSVar4[fix_1.Z._4_4_].SatVelocity.Y;
        dVar7 = pSVar4[fix_1.Z._4_4_].SatVelocity.Z;
        pdVar16 = (double *)(&(this->result).field_0x70 + (long)fix_1.Z._4_4_ * 0x18);
        dVar8 = *pdVar16;
        dVar19 = *(double *)*(undefined1 (*) [16])(pdVar16 + 1);
        dVar9 = pdVar16[2];
        uVar13 = (this->result).UserPositionXYZ.Y;
        uVar14 = (this->result).UserPositionXYZ.Z;
        b_00.Y = (double)uVar14;
        b_00.X = (double)uVar13;
        a_00.Z = (this->result).UserPositionXYZ.X;
        a_00._0_16_ = *(undefined1 (*) [16])(pdVar16 + 1);
        b_00.Z = in_stack_fffffffffffffc68;
        dVar17 = dist(a_00,b_00);
        dVar18 = (-dVar8 + dVar20) / dVar17;
        dVar19 = (-dVar19 + dVar2) / dVar17;
        dVar17 = (-dVar9 + dVar3) / dVar17;
        dVar8 = (*BDSPosAndVel)[fix_1.Z._4_4_].clkdot;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&P.data,fix.Z._4_4_,0);
        *pdVar16 = dVar18;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&P.data,fix.Z._4_4_,1);
        *pdVar16 = dVar19;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&P.data,fix.Z._4_4_,2);
        *pdVar16 = dVar17;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&P.data,fix.Z._4_4_,3);
        *pdVar16 = 1.0;
        fVar1 = (*BDSObs)[fix_1.Z._4_4_].dopp[0];
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&RefV.Z,fix.Z._4_4_,0);
        *pdVar16 = (dVar8 * 299792458.0 +
                   (((double)-fVar1 * 299792458.0) / 1561098000.0 -
                   (-dVar17 * dVar7 + -dVar18 * dVar5 + -(dVar19 * dVar6)))) - 0.0;
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&w.data,fix.Z._4_4_,fix.Z._4_4_);
        *pdVar16 = 1.0;
        fix.Z._4_4_ = fix.Z._4_4_ + 1;
      }
      fix_1.Z._4_4_ = fix_1.Z._4_4_ + 1;
    }
    B_T.data._4_4_ = 0;
    join_0x00000010_0x00000000_ =
         Matrix<double,_-1,_-1>::transpose((Matrix<double,__1,__1> *)&P.data);
    join_0x00000010_0x00000000_ =
         Matrix<double,-1,-1>::operator*
                   ((Matrix<double,_1,_1> *)&tmp1.data,(Matrix<double,__1,__1> *)&w.data);
    join_0x00000010_0x00000000_ =
         Matrix<double,-1,-1>::operator*
                   ((Matrix<double,_1,_1> *)&tmp2.data,(Matrix<double,__1,__1> *)&P.data);
    join_0x00000010_0x00000000_ =
         Matrix<double,_-1,_-1>::inverse
                   ((Matrix<double,__1,__1> *)&tmp3.data,(int *)((long)&B_T.data + 4));
    join_0x00000010_0x00000000_ =
         Matrix<double,-1,-1>::operator*
                   ((Matrix<double,_1,_1> *)&tmp4.data,(Matrix<double,__1,__1> *)&tmp1.data);
    join_0x00000010_0x00000000_ =
         Matrix<double,-1,-1>::operator*
                   ((Matrix<double,_1,_1> *)&tmp5.data,(Matrix<double,__1,__1> *)&w.data);
    join_0x00000010_0x00000000_ =
         Matrix<double,-1,-1>::operator*
                   ((Matrix<double,_1,_1> *)&v.data,(Matrix<double,__1,__1> *)&RefV.Z);
    if (B_T.data._4_4_ == 0) {
      pdVar16 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,0,0);
      local_b8 = (undefined1  [8])(*pdVar16 + (double)local_b8);
      pdVar16 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,1,0);
      RefV.X = *pdVar16 + RefV.X;
      pdVar16 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,2,0);
      RefV.Y = *pdVar16 + RefV.Y;
      Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)&tmp6.data,3,0);
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&P.data,(Matrix<double,__1,__1> *)&tmp6.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,_-1,_-1>::operator-
                     ((Matrix<double,__1,__1> *)&tmp7.data,(Matrix<double,__1,__1> *)&RefV.Z);
      join_0x00000010_0x00000000_ =
           Matrix<double,_-1,_-1>::transpose((Matrix<double,__1,__1> *)&tmp8.data);
      join_0x00000010_0x00000000_ =
           Matrix<double,-1,-1>::operator*
                     ((Matrix<double,_1,_1> *)&tmp9.data,(Matrix<double,__1,__1> *)&w.data);
      _auStack_310 = Matrix<double,-1,-1>::operator*
                               ((Matrix<double,_1,_1> *)&tmp10.data,
                                (Matrix<double,__1,__1> *)&tmp8.data);
      pdVar16 = Matrix<double,_-1,_-1>::operator()((Matrix<double,__1,__1> *)auStack_310,0,0);
      dx.data = (double *)sqrt(*pdVar16 / (double)(i + cols + -4));
      (this->result).UserVelocitySigma = (double)dx.data;
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp7.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp8.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp9.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp10.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)auStack_310);
      Matrix<double,_3,_1>::Matrix((Matrix<double,_3,_1> *)local_330);
      for (local_334 = 0; iVar15 = Matrix<double,_3,_1>::row((Matrix<double,_3,_1> *)local_330),
          local_334 < iVar15; local_334 = local_334 + 1) {
        pdVar16 = Matrix<double,_-1,_-1>::operator()
                            ((Matrix<double,__1,__1> *)&tmp6.data,local_334,0);
        dVar20 = *pdVar16;
        pdVar16 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)local_330,local_334,0);
        *pdVar16 = dVar20;
      }
      Matrix<double,_3,_1>::deleteMatrix((Matrix<double,_3,_1> *)local_330);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp1.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp2.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp3.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp4.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp5.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&v.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp6.data);
      (this->result).UserVelocity.X = (double)local_b8;
      (this->result).UserVelocity.Y = RefV.X;
      (this->result).UserVelocity.Z = RefV.Y;
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&P.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&w.data);
      Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&RefV.Z);
      pcVar10 = (code *)invalidInstructionException();
      (*pcVar10)();
    }
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp1.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp2.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp3.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp4.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp5.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&v.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&w.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&RefV.Z);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&P.data);
    Matrix<double,_-1,_-1>::deleteMatrix((Matrix<double,__1,__1> *)&tmp6.data);
    this_local._4_4_ = 5;
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int SPP::solveSPV(Satellite* &&GPSPosAndVel, Satellite* &&BDSPosAndVel,
             Obs* &&GPSObs, Obs* &&BDSObs, Ephemeris* &&GPSEph,
             Ephemeris* &&BDSEph, ELLIPSOID type)
{
    int GPSObsNum = 0, BDSObsNum = 0;
    int cols = 4;
    for(int i = 0; i < MAXGPSSRN; ++i)
        if(GPSPosAndVel[i].n != -1 && GPSObs[i].dopp[0] != -1)
            GPSObsNum ++;
    for(int i = 0; i < MAXBDSSRN; ++i)
        if(BDSPosAndVel[i].n != -1 && BDSObs[i].dopp[0] != -1)
            BDSObsNum ++;
    // BDSObsNum = 0;
    XYZ RefPos = this->result.UserPositionXYZ;
    if(RefPos.Z == -1)
        return 1;
    // n * m
    MatrixXd B(BDSObsNum + GPSObsNum, cols);
    // n * n
    MatrixXd P(B.row(), B.row());
    // n * 1
    MatrixXd w(B.row(), 1);
    XYZ RefV(0, 0, 0);
    B.Zero();
    P.Zero();
    int count = 0;
    // cout << GPSObsNum << endl;
    double R = 0;
    int num = 0;
    for(int prn = 0; prn < MAXGPSSRN; ++prn)
    {
        if(GPSObsNum == 0)
            break;
        if(GPSPosAndVel[prn].n == -1 ||
            GPSObs[prn].dopp[0] == -1)
            continue;

        XYZ fix = GPSPosAndVel[prn].SatVelocity;
        // 在SPP时已经自转改正  故不需要再次改正
        XYZ SatPosi = this->result.GPSPosi[prn];
        XYZ pos = this->result.UserPositionXYZ;
        double rou = dist(SatPosi, pos);
        // double rou = this->result.GPSDist[prn];
        double l = (-SatPosi.X + RefPos.X) / rou; 
        double m = (-SatPosi.Y + RefPos.Y) / rou;
        double n = (-SatPosi.Z + RefPos.Z) / rou;

        double deltatdot = GPSPosAndVel[prn].clkdot;//GPSEph[prn].af1 + 2 * GPSEph[prn].af2 *
                            //(GPSPosAndVel[prn].t - GPSPosAndVel[prn].deltat - GPSEph[prn].toc);

        double roudot = -l * (fix.X) - m * (fix.Y) - n * (fix.Z);

        B(num, 0) = l;
        B(num, 1) = m;
        B(num, 2) = n;
        B(num, 3) = 1;
        w(num, 0) = -GPSObs[prn].dopp[0] * LIGHTSPEED / GPSL1 -
                    roudot + deltatdot * LIGHTSPEED - R;
        P(num, num) = 1;
        num ++;
    }
    for(int prn = 0; prn < MAXBDSSRN; ++prn)
    {
        if(BDSObsNum == 0)
            break;
        if(BDSPosAndVel[prn].n == -1 ||
            BDSObs[prn].dopp[0] == -1)
            continue;
        // 地球自转改正
        XYZ fix = BDSPosAndVel[prn].SatVelocity;
        // EarthRotationFix(BDSPosAndVel[prn].deltat, BDSPosAndVel[prn].SatVelocity, BDS, fix);
        // 在SPP时已经自转改正  故不需要再次改正
        XYZ SatPosi = this->result.BDSPosi[prn];
        XYZ pos = this->result.UserPositionXYZ;
        double rou = dist(SatPosi, pos);
        // double rou = this->result.BDSDist[prn];
        double l = (-SatPosi.X + RefPos.X) / rou; 
        double m = (-SatPosi.Y + RefPos.Y) / rou;
        double n = (-SatPosi.Z + RefPos.Z) / rou;

        double deltatdot = BDSPosAndVel[prn].clkdot;//BDSEph[prn].af1 + 2 * BDSEph[prn].af2 *
                            //(BDSPosAndVel[prn].t - BDSPosAndVel[prn].deltat - BDSEph[prn].toc);

        double roudot = -l * (fix.X) - m * (fix.Y) - n * (fix.Z);

        B(num, 0) = l;
        B(num, 1) = m;
        B(num, 2) = n;
        B(num, 3) = 1;
        w(num, 0) = -BDSObs[prn].dopp[0] * LIGHTSPEED / BDSB1 -
                    roudot + deltatdot * LIGHTSPEED - R;
        P(num, num) = 1;
        num ++;
    }
    int flag = 0;
    MatrixXd B_T = B.transpose();
    MatrixXd tmp1 = B_T * P;
    MatrixXd tmp2 = tmp1 * B;
    MatrixXd tmp3 = tmp2.inverse(flag);
    MatrixXd tmp4 = tmp3 * B_T;
    MatrixXd tmp5 = tmp4 * P;
    MatrixXd v = tmp5 * w;

    if(flag != 0){
        B_T.deleteMatrix();
        tmp1.deleteMatrix();
        tmp2.deleteMatrix();
        tmp3.deleteMatrix();
        tmp4.deleteMatrix();
        tmp5.deleteMatrix();
        P.deleteMatrix();
        w.deleteMatrix();
        B.deleteMatrix();
        v.deleteMatrix();
        return NOT_INVERTIBLE;
    }
    
    RefV.X += v(0, 0);
    RefV.Y += v(1, 0);
    RefV.Z += v(2, 0);
    R += v(3, 0);
    
    MatrixXd tmp6 = B * v;
    MatrixXd tmp7 = tmp6 - w;
    MatrixXd tmp8 = tmp7.transpose();
    MatrixXd tmp9 = tmp8 * P;
    MatrixXd tmp10 = tmp9 * tmp7;
    int Obsnum = 4;
    double sigma = sqrt(tmp10(0, 0) / (BDSObsNum + GPSObsNum - Obsnum));
    result.UserVelocitySigma = sigma;

    tmp6.deleteMatrix();
    tmp7.deleteMatrix();
    tmp8.deleteMatrix();
    tmp9.deleteMatrix();
    tmp10.deleteMatrix();

    Vector3d dx;
    for(int i = 0; i < dx.row(); i++)
        dx(i, 0) = v(i, 0);
    dx.deleteMatrix();
    B_T.deleteMatrix();
    tmp1.deleteMatrix();
    tmp2.deleteMatrix();
    tmp3.deleteMatrix();
    tmp4.deleteMatrix();
    tmp5.deleteMatrix();
    v.deleteMatrix();
    this->result.UserVelocity = RefV;
    B.deleteMatrix();
    P.deleteMatrix();
    w.deleteMatrix();
}